

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::dart_library
          (string *__return_storage_ptr__,t_dart_generator *this,string *file_name)

{
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_60,"library ",&this->library_prefix_);
  std::operator+(&local_40,&local_60,&this->library_name_);
  std::__cxx11::string::~string((string *)&local_60);
  if (file_name->_M_string_length != 0) {
    if ((this->library_prefix_)._M_string_length == 0) {
      std::operator+(&local_60,".src.",file_name);
      std::__cxx11::string::append((string *)&local_40);
    }
    else {
      std::operator+(&local_60,".",file_name);
      std::__cxx11::string::append((string *)&local_40);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::operator+(__return_storage_ptr__,&local_40,";\n");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::dart_library(string file_name) {
  string out = "library " + library_prefix_ + library_name_;
  if (!file_name.empty()) {
    if (library_prefix_.empty()) {
      out += ".src." + file_name;
    } else {
      out += "." + file_name;
    }
  }
  return out + ";\n";
}